

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuscpp2xml.cpp
# Opt level: O0

QString * addFunction(FunctionDef *mm,bool isSignal)

{
  QLatin1StringView s;
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  QString *pQVar5;
  qsizetype qVar6;
  const_reference pQVar7;
  ulong uVar8;
  byte in_DL;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  int wantedMask;
  char *typeName_1;
  char *signature;
  bool isOutput;
  qsizetype j;
  bool isScriptable;
  int inputCount;
  char *typeName;
  int typeId;
  QString *retval;
  QString name;
  QString errorMsg;
  QList<QMetaType> types;
  QList<ArgumentDef> names;
  QString xml;
  QList<ArgumentDef> *in_stack_fffffffffffffb68;
  QList<ArgumentDef> *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  uint in_stack_fffffffffffffb7c;
  uint uVar15;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  undefined6 in_stack_fffffffffffffb88;
  undefined6 uVar16;
  undefined2 in_stack_fffffffffffffb8e;
  QChar fillChar;
  QLatin1String *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  undefined1 uVar17;
  QString *in_stack_fffffffffffffba0;
  QString *in_stack_fffffffffffffba8;
  char *pcVar18;
  char *t;
  QString *pQVar19;
  uint local_414;
  long local_3f0;
  byte local_3e5;
  QChar local_3b2;
  QLatin1StringView local_3b0;
  storage_type *local_3a0;
  undefined1 local_390 [54];
  QChar local_35a [15];
  QChar local_33c;
  QChar local_33a;
  QLatin1StringView local_338;
  storage_type *local_328;
  undefined1 local_318 [96];
  QMetaType local_2b8;
  QMetaType local_2b0;
  QLatin1StringView local_2a8;
  storage_type *local_288;
  undefined1 local_278 [48];
  QMetaTypeInterface *local_248;
  QChar local_23a [13];
  storage_type *local_220;
  undefined1 local_210 [48];
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  QMetaTypeInterface *local_1c8;
  QMetaTypeInterface *local_1c0;
  QDebug local_180;
  QString local_178;
  QList<QMetaType> local_160;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  QDebug local_110;
  QChar local_102 [13];
  storage_type *local_e8;
  undefined1 local_d8 [48];
  QMetaType local_a8;
  QChar local_9a [13];
  storage_type *local_80;
  undefined1 local_70 [48];
  QMetaType local_40;
  QByteArrayView local_38;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  if (bVar1 == 0) {
    pcVar18 = "method";
  }
  else {
    pcVar18 = "signal";
  }
  t = pcVar18;
  pQVar19 = in_RDI;
  pcVar4 = QByteArray::constData((QByteArray *)0x17d8a1);
  QString::asprintf((char *)&local_20,"    <%s name=\"%s\">\n",pcVar18,pcVar4);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (QByteArray *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_28 = QMetaType::fromName(local_38);
  iVar3 = QMetaType::id((QMetaType *)in_stack_fffffffffffffb70,
                        (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  if (iVar3 != 0x2b) {
    if (iVar3 == 0) {
      bVar2 = QByteArray::isEmpty((QByteArray *)0x17db42);
      if (!bVar2) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),(char *)in_stack_fffffffffffffb68
                  );
        QMessageLogger::warning();
        QDebug::operator<<((QDebug *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),t
                          );
        QByteArray::constData((QByteArray *)0x17db9f);
        QDebug::operator<<((QDebug *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),t
                          );
        QDebug::~QDebug(&local_110);
        QString::QString((QString *)0x17dbc3);
        goto LAB_0017e5f1;
      }
    }
    else {
      QMetaType::QMetaType(&local_40,iVar3);
      pcVar18 = (char *)QDBusMetaType::typeToSignature((QMetaType *)local_40.d_ptr);
      if (pcVar18 == (char *)0x0) {
        QString::QString((QString *)0x17db1c);
        goto LAB_0017e5f1;
      }
      QByteArrayView::QByteArrayView<40ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (char (*) [40])CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QVar9.m_data = local_80;
      QVar9.m_size = (qsizetype)local_70;
      QString::fromLatin1(QVar9);
      typeNameToXml((char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      QChar::QChar<char16_t,_true>(local_9a,L' ');
      QString::arg<QString,_true>
                ((QString *)in_stack_fffffffffffffb90,
                 (QString *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb84,(QChar)(char16_t)((ulong)t >> 0x30));
      QString::operator+=((QString *)in_stack_fffffffffffffb70,(QString *)in_stack_fffffffffffffb68)
      ;
      QString::~QString((QString *)0x17da01);
      QString::~QString((QString *)0x17da0e);
      QString::~QString((QString *)0x17da1b);
      local_a8.d_ptr = (QMetaTypeInterface *)QDBusMetaType::signatureToMetaType(pcVar18);
      bVar2 = QMetaType::isValid(&local_a8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        QByteArrayView::QByteArrayView<76ul>
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (char (*) [76])CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QVar10.m_data = local_e8;
        QVar10.m_size = (qsizetype)local_d8;
        QString::fromLatin1(QVar10);
        QByteArray::constData((QByteArray *)0x17da8a);
        typeNameToXml((char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        QChar::QChar<char16_t,_true>(local_102,L' ');
        QString::arg<QString,_true>
                  ((QString *)in_stack_fffffffffffffb90,
                   (QString *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),
                   in_stack_fffffffffffffb84,(QChar)(char16_t)((ulong)t >> 0x30));
        QString::operator+=((QString *)in_stack_fffffffffffffb70,
                            (QString *)in_stack_fffffffffffffb68);
        QString::~QString((QString *)0x17daf6);
        QString::~QString((QString *)0x17db03);
        QString::~QString((QString *)0x17db10);
      }
    }
  }
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  QList<ArgumentDef>::QList(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  local_160.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_160.d.ptr = (QMetaType *)&DAT_aaaaaaaaaaaaaaaa;
  local_160.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QMetaType>::QList((QList<QMetaType> *)0x17dc57);
  local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x17dc91);
  iVar3 = qDBusParametersForMethod
                    ((FunctionDef *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
                     (QList<QMetaType> *)in_stack_fffffffffffffb90,
                     (QString *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
  if (iVar3 == -1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),(char *)in_stack_fffffffffffffb68);
    QMessageLogger::warning();
    QtPrivate::asString(&local_178);
    QString::toLocal8Bit((QString *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
    QByteArray::constData((QByteArray *)0x17dd18);
    QDebug::operator<<((QDebug *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),t);
    QByteArray::~QByteArray((QByteArray *)0x17dd35);
    QDebug::~QDebug(&local_180);
    QString::QString((QString *)0x17dd4c);
  }
  else {
    if (bVar1 != 0) {
      in_stack_fffffffffffffba0 = (QString *)(long)(iVar3 + 1);
      pQVar5 = (QString *)QList<QMetaType>::size(&local_160);
      if (in_stack_fffffffffffffba0 != pQVar5) {
        QString::QString((QString *)0x17dd9b);
        goto LAB_0017e5ca;
      }
    }
    bVar2 = false;
    if (bVar1 != 0) {
      in_stack_fffffffffffffb90 =
           (QLatin1String *)
           QList<QMetaType>::at
                     ((QList<QMetaType> *)in_stack_fffffffffffffb70,
                      (qsizetype)in_stack_fffffffffffffb68);
      local_1c0 = (QMetaTypeInterface *)QDBusMetaTypeId::message();
      bVar2 = operator==((QMetaType *)in_stack_fffffffffffffb70,
                         (QMetaType *)in_stack_fffffffffffffb68);
    }
    if (bVar2 == false) {
      local_3e5 = *(byte *)(in_RSI + 200) & 1;
      local_3f0 = 1;
      uVar17 = 0;
      while( true ) {
        uVar16 = (undefined6)local_3f0;
        fillChar.ucs = (char16_t)((ulong)local_3f0 >> 0x30);
        qVar6 = QList<QMetaType>::size(&local_160);
        if (qVar6 <= CONCAT26(fillChar.ucs,uVar16)) break;
        pQVar7 = QList<QMetaType>::at
                           ((QList<QMetaType> *)in_stack_fffffffffffffb70,
                            (qsizetype)in_stack_fffffffffffffb68);
        in_stack_fffffffffffffb80 = SUB84(pQVar7,0);
        in_stack_fffffffffffffb84 = (int)((ulong)pQVar7 >> 0x20);
        local_1c8 = (QMetaTypeInterface *)QDBusMetaTypeId::message();
        bVar2 = operator==((QMetaType *)in_stack_fffffffffffffb70,
                           (QMetaType *)in_stack_fffffffffffffb68);
        if (bVar2) {
          local_3e5 = 1;
        }
        else {
          local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)0x17def0);
          QList<ArgumentDef>::at(in_stack_fffffffffffffb70,(qsizetype)in_stack_fffffffffffffb68);
          bVar2 = QByteArray::isEmpty((QByteArray *)0x17df15);
          if (!bVar2) {
            QByteArrayView::QByteArrayView<11ul>
                      ((QByteArrayView *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (char (*) [11])CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
            ;
            QVar11.m_data = local_220;
            QVar11.m_size = (qsizetype)local_210;
            QString::fromLatin1(QVar11);
            QList<ArgumentDef>::at(in_stack_fffffffffffffb70,(qsizetype)in_stack_fffffffffffffb68);
            QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffb70);
            QChar::QChar<char16_t,_true>(local_23a,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffb90,(QString *)CONCAT26(fillChar.ucs,uVar16)
                       ,in_stack_fffffffffffffb84,(QChar)(char16_t)((ulong)t >> 0x30));
            QString::operator=((QString *)in_stack_fffffffffffffb70,
                               (QString *)in_stack_fffffffffffffb68);
            QString::~QString((QString *)0x17dfd7);
            QString::~QString((QString *)0x17dfe4);
            QString::~QString((QString *)0x17dff1);
          }
          uVar15 = CONCAT13(1,(int3)in_stack_fffffffffffffb7c);
          if (bVar1 == 0) {
            uVar15 = CONCAT13(iVar3 < local_3f0,(int3)in_stack_fffffffffffffb7c);
          }
          in_stack_fffffffffffffb7c = uVar15;
          pQVar7 = QList<QMetaType>::at
                             ((QList<QMetaType> *)in_stack_fffffffffffffb70,
                              (qsizetype)in_stack_fffffffffffffb68);
          local_248 = pQVar7->d_ptr;
          pcVar18 = (char *)QDBusMetaType::typeToSignature((QMetaType *)local_248);
          QByteArrayView::QByteArrayView<41ul>
                    ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                     ,(char (*) [41])CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          QVar12.m_data = local_288;
          QVar12.m_size = (qsizetype)local_278;
          QString::fromLatin1(QVar12);
          QLatin1String::QLatin1String
                    ((QLatin1String *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          if ((uVar15 & 0x1000000) == 0) {
            local_2a8 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                    in_stack_fffffffffffffb78),
                                   (size_t)in_stack_fffffffffffffb70);
          }
          else {
            local_2a8 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                    in_stack_fffffffffffffb78),
                                   (size_t)in_stack_fffffffffffffb70);
          }
          QString::arg<QString&,QLatin1String,QLatin1String>
                    (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                     (QLatin1String *)CONCAT17(uVar17,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffb90);
          QString::operator+=((QString *)in_stack_fffffffffffffb70,
                              (QString *)in_stack_fffffffffffffb68);
          QString::~QString((QString *)0x17e140);
          QString::~QString((QString *)0x17e14d);
          local_2b0.d_ptr = (QMetaTypeInterface *)QDBusMetaType::signatureToMetaType(pcVar18);
          bVar2 = QMetaType::isValid(&local_2b0);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pQVar7 = QList<QMetaType>::at
                               ((QList<QMetaType> *)in_stack_fffffffffffffb70,
                                (qsizetype)in_stack_fffffffffffffb68);
            local_2b8.d_ptr = pQVar7->d_ptr;
            QMetaType::name(&local_2b8);
            QByteArrayView::QByteArrayView<76ul>
                      ((QByteArrayView *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (char (*) [76])CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
            ;
            QVar13.m_data = local_328;
            QVar13.m_size = (qsizetype)local_318;
            QString::fromLatin1(QVar13);
            if ((uVar15 & 0x1000000) == 0) {
              local_338 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                      in_stack_fffffffffffffb78),
                                     (size_t)in_stack_fffffffffffffb70);
            }
            else {
              local_338 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                      in_stack_fffffffffffffb78),
                                     (size_t)in_stack_fffffffffffffb70);
            }
            QChar::QChar<char16_t,_true>(&local_33a,L' ');
            QString::arg<QLatin1String,_true>
                      ((QString *)CONCAT26(fillChar.ucs,uVar16),
                       (QLatin1String *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       in_stack_fffffffffffffb7c,(QChar)(char16_t)((ulong)pQVar19 >> 0x30));
            if (((uVar15 & 0x1000000) == 0) || (bVar1 != 0)) {
              in_stack_fffffffffffffb68 = (QList<ArgumentDef> *)(local_3f0 + -1);
            }
            else {
              in_stack_fffffffffffffb68 = (QList<ArgumentDef> *)(local_3f0 - iVar3);
            }
            in_stack_fffffffffffffb70 = in_stack_fffffffffffffb68;
            QChar::QChar<char16_t,_true>(&local_33c,L' ');
            QString::arg<long_long,_true>
                      ((QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                       (longlong)in_stack_fffffffffffffb70,
                       (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                       (int)in_stack_fffffffffffffb68,fillChar);
            typeNameToXml((char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
            QChar::QChar<char16_t,_true>(local_35a,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffb90,(QString *)CONCAT26(fillChar.ucs,uVar16)
                       ,in_stack_fffffffffffffb84,(QChar)(char16_t)((ulong)t >> 0x30));
            QString::operator+=((QString *)in_stack_fffffffffffffb70,
                                (QString *)in_stack_fffffffffffffb68);
            QString::~QString((QString *)0x17e35d);
            QString::~QString((QString *)0x17e36a);
            QString::~QString((QString *)0x17e377);
            QString::~QString((QString *)0x17e384);
            QString::~QString((QString *)0x17e391);
          }
          QString::~QString((QString *)0x17e39e);
        }
        local_3f0 = local_3f0 + 1;
      }
      if (local_3e5 == 0) {
        local_414 = 0x100;
        if (bVar1 != 0) {
          local_414 = 0x200;
        }
      }
      else {
        local_414 = 0x10;
        if (bVar1 != 0) {
          local_414 = 0x20;
        }
      }
      if ((flags & local_414) == local_414) {
        pcVar18 = QByteArray::constData((QByteArray *)0x17e44b);
        uVar8 = qDBusCheckAsyncTag(pcVar18);
        if ((uVar8 & 1) != 0) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (size_t)in_stack_fffffffffffffb70);
          s.m_size._4_4_ = in_stack_fffffffffffffb84;
          s.m_size._0_4_ = in_stack_fffffffffffffb80;
          s.m_data._0_6_ = uVar16;
          s.m_data._6_2_ = fillChar.ucs;
          QString::operator+=((QString *)in_stack_fffffffffffffb68,s);
        }
        (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)in_stack_fffffffffffffb70,(QString *)in_stack_fffffffffffffb68);
        QByteArrayView::QByteArrayView<11ul>
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (char (*) [11])CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QVar14.m_data = local_3a0;
        QVar14.m_size = (qsizetype)local_390;
        QString::fromLatin1(QVar14);
        if (bVar1 == 0) {
          local_3b0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                  in_stack_fffffffffffffb78),
                                 (size_t)in_stack_fffffffffffffb70);
        }
        else {
          local_3b0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                  in_stack_fffffffffffffb78),
                                 (size_t)in_stack_fffffffffffffb70);
        }
        QChar::QChar<char16_t,_true>(&local_3b2,L' ');
        QString::arg<QLatin1String,_true>
                  ((QString *)CONCAT26(fillChar.ucs,uVar16),
                   (QLatin1String *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb7c,(QChar)(char16_t)((ulong)pQVar19 >> 0x30));
        QString::operator+=((QString *)in_stack_fffffffffffffb70,
                            (QString *)in_stack_fffffffffffffb68);
        QString::~QString((QString *)0x17e59a);
        QString::~QString((QString *)0x17e5a7);
      }
      else {
        QString::QString((QString *)0x17e42a);
      }
    }
    else {
      QString::QString((QString *)0x17de0c);
    }
  }
LAB_0017e5ca:
  QString::~QString((QString *)0x17e5d7);
  QList<QMetaType>::~QList((QList<QMetaType> *)0x17e5e4);
  QList<ArgumentDef>::~QList((QList<ArgumentDef> *)0x17e5f1);
LAB_0017e5f1:
  QString::~QString((QString *)0x17e5fe);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar19;
  }
  __stack_chk_fail();
}

Assistant:

static QString addFunction(const FunctionDef &mm, bool isSignal = false) {

    QString xml = QString::asprintf("    <%s name=\"%s\">\n",
                                    isSignal ? "signal" : "method", mm.name.constData());

    // check the return type first
    int typeId = QMetaType::fromName(mm.normalizedType).id();
    if (typeId != QMetaType::Void) {
        if (typeId) {
            const char *typeName = QDBusMetaType::typeToSignature(QMetaType(typeId));
            if (typeName) {
                xml += QString::fromLatin1("      <arg type=\"%1\" direction=\"out\"/>\n")
                        .arg(typeNameToXml(typeName));

                    // do we need to describe this argument?
                    if (!QDBusMetaType::signatureToMetaType(typeName).isValid())
                        xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.Out0\" value=\"%1\"/>\n")
                            .arg(typeNameToXml(mm.normalizedType.constData()));
            } else {
                return QString();
            }
        } else if (!mm.normalizedType.isEmpty()) {
            qWarning() << "Unregistered return type:" << mm.normalizedType.constData();
            return QString();
        }
    }
    QList<ArgumentDef> names = mm.arguments;
    QList<QMetaType> types;
    QString errorMsg;
    int inputCount = qDBusParametersForMethod(mm, types, errorMsg);
    if (inputCount == -1) {
        qWarning() << qPrintable(errorMsg);
        return QString();           // invalid form
    }
    if (isSignal && inputCount + 1 != types.size())
        return QString();           // signal with output arguments?
    if (isSignal && types.at(inputCount) == QDBusMetaTypeId::message())
        return QString();           // signal with QDBusMessage argument?

    bool isScriptable = mm.isScriptable;
    for (qsizetype j = 1; j < types.size(); ++j) {
        // input parameter for a slot or output for a signal
        if (types.at(j) == QDBusMetaTypeId::message()) {
            isScriptable = true;
            continue;
        }

        QString name;
        if (!names.at(j - 1).name.isEmpty())
            name = QString::fromLatin1("name=\"%1\" ").arg(QString::fromLatin1(names.at(j - 1).name));

        bool isOutput = isSignal || j > inputCount;

        const char *signature = QDBusMetaType::typeToSignature(QMetaType(types.at(j)));
        xml += QString::fromLatin1("      <arg %1type=\"%2\" direction=\"%3\"/>\n")
                .arg(name,
                     QLatin1StringView(signature),
                     isOutput ? "out"_L1 : "in"_L1);

        // do we need to describe this argument?
        if (!QDBusMetaType::signatureToMetaType(signature).isValid()) {
            const char *typeName = QMetaType(types.at(j)).name();
            xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.%1%2\" value=\"%3\"/>\n")
                    .arg(isOutput ? "Out"_L1 : "In"_L1)
                    .arg(isOutput && !isSignal ? j - inputCount : j - 1)
                    .arg(typeNameToXml(typeName));
        }
    }

    int wantedMask;
    if (isScriptable)
        wantedMask = isSignal ? QDBusConnection::ExportScriptableSignals
                              : QDBusConnection::ExportScriptableSlots;
    else
        wantedMask = isSignal ? QDBusConnection::ExportNonScriptableSignals
                              : QDBusConnection::ExportNonScriptableSlots;
    if ((flags & wantedMask) != wantedMask)
        return QString();

    if (qDBusCheckAsyncTag(mm.tag.constData()))
        // add the no-reply annotation
        xml += "      <annotation name=\"" ANNOTATION_NO_WAIT "\" value=\"true\"/>\n"_L1;

    QString retval = xml;
    retval += QString::fromLatin1("    </%1>\n").arg(isSignal ? "signal"_L1 : "method"_L1);

    return retval;
}